

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O0

Var Js::JavascriptOperators::PatchGetRootMethodNoFastPath
              (FunctionBody *functionBody,InlineCache *inlineCache,InlineCacheIndex inlineCacheIndex
              ,DynamicObject *object,PropertyId propertyId)

{
  code *pcVar1;
  undefined4 propertyId_00;
  bool bVar2;
  undefined4 *puVar3;
  ScriptContext *scriptContext;
  Var pvVar4;
  undefined1 local_70 [8];
  PropertyValueInfo info;
  PropertyId propertyId_local;
  DynamicObject *object_local;
  InlineCacheIndex inlineCacheIndex_local;
  InlineCache *inlineCache_local;
  FunctionBody *functionBody_local;
  
  info._60_4_ = propertyId;
  bVar2 = VarIs<Js::RootObjectBase,Js::DynamicObject>(object);
  if (!bVar2) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Language/JavascriptOperators.cpp"
                                ,0x2113,"(VarIs<RootObjectBase>(object))",
                                "Root must be a global object!");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_70);
  PropertyValueInfo::SetCacheInfo
            ((PropertyValueInfo *)local_70,functionBody,inlineCache,inlineCacheIndex,true);
  propertyId_00 = info._60_4_;
  scriptContext = FunctionProxy::GetScriptContext((FunctionProxy *)functionBody);
  pvVar4 = PatchGetMethodFromObject
                     (object,&object->super_RecyclableObject,propertyId_00,
                      (PropertyValueInfo *)local_70,scriptContext,true);
  return pvVar4;
}

Assistant:

Var JavascriptOperators::PatchGetRootMethodNoFastPath(FunctionBody *const functionBody, InlineCache *const inlineCache, const InlineCacheIndex inlineCacheIndex, DynamicObject* object, PropertyId propertyId)
    {
        AssertMsg(VarIs<RootObjectBase>(object), "Root must be a global object!");

        PropertyValueInfo info;
        PropertyValueInfo::SetCacheInfo(&info, functionBody, inlineCache, inlineCacheIndex, true);
        return Js::JavascriptOperators::PatchGetMethodFromObject(object, object, propertyId, &info, functionBody->GetScriptContext(), true);
    }